

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

bool CheckFunctionForInlining(VmFunction *function)

{
  VmInstructionType VVar1;
  VmInstruction *pVVar2;
  VmValue **ppVVar3;
  VmFunction *pVVar4;
  int iVar5;
  VmInstruction **ppVVar6;
  VmBlock *pVVar7;
  bool bVar8;
  
  pVVar7 = function->firstBlock;
  if (pVVar7 == (VmBlock *)0x0) {
LAB_0025926b:
    bVar8 = false;
  }
  else {
    iVar5 = 0;
    bVar8 = false;
    if ((function->restoreBlocks).count == 0) {
      for (; (bVar8 = pVVar7 == (VmBlock *)0x0, !bVar8 && (pVVar7->nextSibling == (VmBlock *)0x0));
          pVVar7 = pVVar7->nextSibling) {
        ppVVar6 = &pVVar7->firstInstruction;
        while (pVVar2 = *ppVVar6, pVVar2 != (VmInstruction *)0x0) {
          VVar1 = pVVar2->cmd;
          if (VVar1 == VM_INST_CALL) {
            ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](&pVVar2->arguments,0);
            if (((*ppVVar3)->type).type == VM_TYPE_FUNCTION_REF) goto LAB_00259221;
            ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](&pVVar2->arguments,1);
            pVVar4 = (VmFunction *)*ppVVar3;
            if ((pVVar4 == (VmFunction *)0x0) || ((pVVar4->super_VmValue).typeID != 4)) {
              pVVar4 = (VmFunction *)0x0;
            }
            if (pVVar4 == function) {
              return false;
            }
            if (0x10 < iVar5 + 1U) {
              return false;
            }
          }
          else {
            if (VVar1 == VM_INST_YIELD) {
              return false;
            }
            if (VVar1 == VM_INST_ABORT_NO_RETURN) {
              return false;
            }
LAB_00259221:
            if (0x10 < iVar5 + 1U) goto LAB_0025926b;
          }
          iVar5 = iVar5 + 1;
          ppVVar6 = &pVVar2->nextSibling;
        }
      }
    }
  }
  return bVar8;
}

Assistant:

bool CheckFunctionForInlining(VmFunction *function)
{
	// Can't inline external function
	if(!function->firstBlock)
		return false;

	// Can't inline coroutines
	if(!function->restoreBlocks.empty())
		return false;

	unsigned instructions = 0;

	for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
	{
		// TODO: remove single block limit
		if(curr->nextSibling)
			return false;

		for(VmInstruction *inst = curr->firstInstruction; inst; inst = inst->nextSibling)
		{
			if(inst->cmd == VM_INST_ABORT_NO_RETURN || inst->cmd == VM_INST_YIELD)
				return false;

			if(inst->cmd == VM_INST_CALL && inst->arguments[0]->type.type != VM_TYPE_FUNCTION_REF)
			{
				VmFunction *targetFunction = getType<VmFunction>(inst->arguments[1]);

				// Can't inline recursive call
				if(function == targetFunction)
					return false;
			}

			// Simplest heuristic, inline small functions
			if(++instructions > 16)
				return false;
		}
	}

	return true;
}